

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ReflectionOpsTest_GenericSwap_Test::TestBody
          (ReflectionOpsTest_GenericSwap_Test *this)

{
  bool bVar1;
  TestAllTypes *pTVar2;
  char *pcVar3;
  AssertHelper local_7b8;
  Message local_7b0;
  uint64_t local_7a8;
  undefined1 local_7a0 [8];
  AssertionResult gtest_ar_1;
  uint64_t initial_arena_size_1;
  TestAllTypes *arena_message_1;
  TestAllTypes message_1;
  Message local_438;
  uint64_t local_430;
  undefined1 local_428 [8];
  AssertionResult gtest_ar;
  uint64_t initial_arena_size;
  TestAllTypes *arena_message;
  undefined1 local_3f8 [8];
  TestAllTypes message;
  Arena arena;
  ReflectionOpsTest_GenericSwap_Test *this_local;
  
  Arena::Arena((Arena *)((long)&message.field_0 + 0x328));
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_3f8);
  pTVar2 = Arena::Create<proto2_unittest::TestAllTypes>((Arena *)((long)&message.field_0 + 0x328));
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(pTVar2);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )Arena::SpaceUsed((Arena *)((long)&message.field_0 + 0x328));
  GenericSwap((Message *)local_3f8,&pTVar2->super_Message);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>((TestAllTypes *)local_3f8);
  TestUtil::ExpectClear<proto2_unittest::TestAllTypes>(pTVar2);
  local_430 = Arena::SpaceUsed((Arena *)((long)&message.field_0 + 0x328));
  testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
            ((internal *)local_428,"arena.SpaceUsed()","initial_arena_size",&local_430,
             (unsigned_long *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
  if (!bVar1) {
    testing::Message::Message(&local_438);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&message_1.field_0 + 0x328),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops_unittest.cc"
               ,0x1fe,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&message_1.field_0 + 0x328),&local_438);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&message_1.field_0 + 0x328));
    testing::Message::~Message(&local_438);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_3f8);
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)&arena_message_1);
  pTVar2 = Arena::Create<proto2_unittest::TestAllTypes>((Arena *)((long)&message.field_0 + 0x328));
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(pTVar2);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )Arena::SpaceUsed((Arena *)((long)&message.field_0 + 0x328));
  GenericSwap(&pTVar2->super_Message,(Message *)&arena_message_1);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>((TestAllTypes *)&arena_message_1);
  TestUtil::ExpectClear<proto2_unittest::TestAllTypes>(pTVar2);
  local_7a8 = Arena::SpaceUsed((Arena *)((long)&message.field_0 + 0x328));
  testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
            ((internal *)local_7a0,"arena.SpaceUsed()","initial_arena_size",&local_7a8,
             (unsigned_long *)&gtest_ar_1.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a0);
  if (!bVar1) {
    testing::Message::Message(&local_7b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_7b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops_unittest.cc"
               ,0x20b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7b8,&local_7b0);
    testing::internal::AssertHelper::~AssertHelper(&local_7b8);
    testing::Message::~Message(&local_7b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a0);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)&arena_message_1);
  Arena::~Arena((Arena *)((long)&message.field_0 + 0x328));
  return;
}

Assistant:

TEST(ReflectionOpsTest, GenericSwap) {
  Arena arena;
  {
    unittest::TestAllTypes message;
    auto* arena_message = Arena::Create<unittest::TestAllTypes>(&arena);
    TestUtil::SetAllFields(arena_message);
    const uint64_t initial_arena_size = arena.SpaceUsed();

    GenericSwap(&message, arena_message);

    TestUtil::ExpectAllFieldsSet(message);
    TestUtil::ExpectClear(*arena_message);
    // The temp should be allocated on the arena in this case.
    EXPECT_GT(arena.SpaceUsed(), initial_arena_size);
  }
  {
    unittest::TestAllTypes message;
    auto* arena_message = Arena::Create<unittest::TestAllTypes>(&arena);
    TestUtil::SetAllFields(arena_message);
    const uint64_t initial_arena_size = arena.SpaceUsed();

    GenericSwap(arena_message, &message);

    TestUtil::ExpectAllFieldsSet(message);
    TestUtil::ExpectClear(*arena_message);
    // The temp should be allocated on the arena in this case.
    EXPECT_GT(arena.SpaceUsed(), initial_arena_size);
  }
}